

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O3

longdouble *
trng::math::detail::inv_Beta_I<long_double>
          (longdouble *__return_storage_ptr__,longdouble x,longdouble p,longdouble q,longdouble norm
          )

{
  longdouble *in_RAX;
  longdouble *plVar1;
  int iVar2;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  
  if (((longdouble)1.0842022e-19 <= x) && ((longdouble)1.0842022e-19 <= (longdouble)1 - x)) {
    lVar6 = (longdouble)1;
    lVar4 = in_ST1;
    if ((p + p < lVar6) || (q + q < lVar6)) {
      lVar3 = in_ST1;
      lVar6 = in_ST1;
      in_ST0 = in_ST1;
      logl();
      logl();
      expl();
      expl();
      if ((in_ST1 / p) / (lVar3 / q + in_ST1 / p) <= x) {
        powl();
        lVar6 = (longdouble)1 - lVar6;
      }
      else {
        powl();
      }
    }
    else {
      lVar3 = p * (longdouble)3.0;
      lVar6 = (-lVar6 + lVar3) / ((longdouble)3.0 * q + lVar3 + (longdouble)-2.0);
    }
    iVar2 = 0;
    do {
      lVar3 = lVar4;
      lVar7 = lVar4;
      lVar8 = lVar4;
      Beta_I<long_double>(__return_storage_ptr__,lVar6,p,q,norm);
      powl();
      plVar1 = (longdouble *)powl();
      if (ABS((in_ST0 - x) / lVar6) < (longdouble)2.1684043e-19) {
        return plVar1;
      }
      lVar3 = (in_ST0 - x) / ((lVar4 * lVar3) / norm);
      lVar5 = lVar6 - lVar3;
      lVar4 = (longdouble)0;
      in_RAX = (longdouble *)CONCAT71((int7)((ulong)plVar1 >> 8),lVar4 < lVar5);
      if (lVar4 >= lVar5 || (longdouble)1 <= lVar5) {
        do {
          lVar3 = lVar3 * (longdouble)0.75;
          lVar5 = lVar6 - lVar3;
          in_RAX = (longdouble *)CONCAT71((int7)((ulong)in_RAX >> 8),lVar5 <= lVar4);
        } while ((longdouble)1 <= lVar5 || lVar5 <= lVar4);
      }
      iVar2 = iVar2 + 1;
      lVar6 = lVar5;
      in_ST0 = lVar7;
      lVar4 = lVar8;
    } while (iVar2 != 0x40);
  }
  return in_RAX;
}

Assistant:

TRNG_CUDA_ENABLE T inv_Beta_I(T x, T p, T q, T norm) {
        if (x < numeric_limits<T>::epsilon())
          return 0;
        if (1 - x < numeric_limits<T>::epsilon())
          return 1;
        // solve via Newton method
        T y{0};
        if (2 * p >= 1 and 2 * q >= 1)
          y = (3 * p - 1) / (3 * p + 3 * q - 2);  // the approximate median
        else {
          // following initial guess given in "Numerical Recipes" by W. H. Press et al., 3rd
          // edition
          const T lnp{ln(p / (p + q))};
          const T lnq{ln(q / (p + q))};
          const T t{exp(p * lnp) / p};
          const T u{exp(q * lnq) / q};
          const T w{t + u};
          if (x < t / w)
            y = pow(p * w * x, 1 / p);
          else
            y = 1 - pow(q * w * (1 - x), 1 / q);
        }
        for (int i{0}; i < numeric_limits<T>::digits; ++i) {
          const T f{Beta_I(y, p, q, norm) - x};
          const T df{pow(1 - y, q - 1) * pow(y, p - 1) / norm};
          T dy(f / df);
          if (abs(f / y) < 2 * numeric_limits<T>::epsilon())
            break;
          // avoid overshooting
          while (y - dy <= 0 or y - dy >= 1)
            dy *= T{3} / T{4};
          y -= dy;
        }
        return y;
      }